

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void rbuStepOneOp(sqlite3rbu *p,int eType)

{
  uint uVar1;
  sqlite3_stmt *pStmt;
  sqlite3_stmt *pStmt_00;
  int iVar2;
  long lVar3;
  Mem *pMVar4;
  sqlite3_value *psVar5;
  char *pcVar6;
  int iVar7;
  
  if (eType == 2) {
    p->nPhaseOneStep = p->nPhaseOneStep - (long)(p->objiter).nIndex;
    lVar3 = 0xe0;
  }
  else {
    lVar3 = (ulong)(eType == 4) * 8 + 0xd8;
  }
  pStmt = *(sqlite3_stmt **)(p->zStateDb + lVar3 + -0x30);
  iVar2 = (p->objiter).nCol;
  if (0 < iVar2) {
    lVar3 = 0;
    do {
      iVar7 = (int)lVar3;
      if (eType == 1) {
        if (((p->objiter).zIdx == (char *)0x0) &&
           (((p->objiter).eType == 2 && ((p->objiter).abTblPk[lVar3] != '\0')))) {
          pStmt_00 = (p->objiter).pSelect;
          pMVar4 = columnMem(pStmt_00,iVar7);
          uVar1._0_2_ = pMVar4->flags;
          uVar1._2_1_ = pMVar4->enc;
          uVar1._3_1_ = pMVar4->eSubtype;
          columnMallocFailure(pStmt_00);
          if ((0xaaaaaaaaU >> (uVar1 & 0x1f) & 1) != 0) {
            p->rc = 0x14;
            pcVar6 = sqlite3_mprintf("datatype mismatch");
            p->zErrmsg = pcVar6;
            return;
          }
        }
LAB_001d212c:
        psVar5 = sqlite3_column_value((p->objiter).pSelect,iVar7);
        iVar2 = sqlite3_bind_value(pStmt,iVar7 + 1,psVar5);
        p->rc = iVar2;
        if (iVar2 != 0) {
          return;
        }
        iVar2 = (p->objiter).nCol;
      }
      else if ((eType != 2) || ((p->objiter).abTblPk[lVar3] != '\0')) goto LAB_001d212c;
      lVar3 = lVar3 + 1;
    } while (lVar3 < iVar2);
  }
  if (((p->objiter).zIdx == (char *)0x0) &&
     (((iVar7 = (p->objiter).eType, iVar7 == 1 || (iVar7 == 5)) ||
      ((iVar7 == 3 && (p->zTarget == (char *)0x0)))))) {
    psVar5 = sqlite3_column_value((p->objiter).pSelect,iVar2 + 1);
    iVar2 = sqlite3_bind_value(pStmt,(p->objiter).nCol + 1,psVar5);
    p->rc = iVar2;
  }
  if (p->rc == 0) {
    sqlite3_step(pStmt);
    iVar2 = resetAndCollectError(pStmt,&p->zErrmsg);
    p->rc = iVar2;
  }
  return;
}

Assistant:

static void rbuStepOneOp(sqlite3rbu *p, int eType){
  RbuObjIter *pIter = &p->objiter;
  sqlite3_value *pVal;
  sqlite3_stmt *pWriter;
  int i;

  assert( p->rc==SQLITE_OK );
  assert( eType!=RBU_DELETE || pIter->zIdx==0 );
  assert( eType==RBU_DELETE || eType==RBU_IDX_DELETE
       || eType==RBU_INSERT || eType==RBU_IDX_INSERT
  );

  /* If this is a delete, decrement nPhaseOneStep by nIndex. If the DELETE
  ** statement below does actually delete a row, nPhaseOneStep will be
  ** incremented by the same amount when SQL function rbu_tmp_insert()
  ** is invoked by the trigger.  */
  if( eType==RBU_DELETE ){
    p->nPhaseOneStep -= p->objiter.nIndex;
  }

  if( eType==RBU_IDX_DELETE || eType==RBU_DELETE ){
    pWriter = pIter->pDelete;
  }else{
    pWriter = pIter->pInsert;
  }

  for(i=0; i<pIter->nCol; i++){
    /* If this is an INSERT into a table b-tree and the table has an
    ** explicit INTEGER PRIMARY KEY, check that this is not an attempt
    ** to write a NULL into the IPK column. That is not permitted.  */
    if( eType==RBU_INSERT 
     && pIter->zIdx==0 && pIter->eType==RBU_PK_IPK && pIter->abTblPk[i] 
     && sqlite3_column_type(pIter->pSelect, i)==SQLITE_NULL
    ){
      p->rc = SQLITE_MISMATCH;
      p->zErrmsg = sqlite3_mprintf("datatype mismatch");
      return;
    }

    if( eType==RBU_DELETE && pIter->abTblPk[i]==0 ){
      continue;
    }

    pVal = sqlite3_column_value(pIter->pSelect, i);
    p->rc = sqlite3_bind_value(pWriter, i+1, pVal);
    if( p->rc ) return;
  }
  if( pIter->zIdx==0 ){
    if( pIter->eType==RBU_PK_VTAB 
     || pIter->eType==RBU_PK_NONE 
     || (pIter->eType==RBU_PK_EXTERNAL && rbuIsVacuum(p)) 
    ){
      /* For a virtual table, or a table with no primary key, the 
      ** SELECT statement is:
      **
      **   SELECT <cols>, rbu_control, rbu_rowid FROM ....
      **
      ** Hence column_value(pIter->nCol+1).
      */
      assertColumnName(pIter->pSelect, pIter->nCol+1, 
          rbuIsVacuum(p) ? "rowid" : "rbu_rowid"
      );
      pVal = sqlite3_column_value(pIter->pSelect, pIter->nCol+1);
      p->rc = sqlite3_bind_value(pWriter, pIter->nCol+1, pVal);
    }
  }
  if( p->rc==SQLITE_OK ){
    sqlite3_step(pWriter);
    p->rc = resetAndCollectError(pWriter, &p->zErrmsg);
  }
}